

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::reparentWidgetWindows
          (QWidgetPrivate *this,QWidget *parentWithWindow,WindowFlags windowFlags)

{
  QWExtra *pQVar1;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar2;
  QWindow *pQVar3;
  QDebug *pQVar4;
  QWidget *this_00;
  long in_FS_OFFSET;
  Stream *local_a0;
  Stream *local_98;
  Stream *local_90;
  undefined1 local_88 [8];
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  char *local_68;
  QDebug local_60;
  Stream *local_58;
  undefined1 local_50 [8];
  Stream *local_48;
  undefined1 local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (((pQVar1 == (QWExtra *)0x0) ||
      (tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
            *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
             &(pQVar1->topextra)._M_t.
              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
      tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
      (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) ||
     (pQVar3 = *(QWindow **)
                ((long)tVar2.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20),
     pQVar3 == (QWindow *)0x0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      reparentWidgetWindowChildren(this,parentWithWindow);
      return;
    }
    goto LAB_003012ba;
  }
  if (parentWithWindow == (QWidget *)0x0) {
    lcWidgetWindow();
    if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_80 = 2;
      local_7c = 0;
      uStack_74 = 0;
      local_6c = 0;
      local_68 = lcWidgetWindow::category.name;
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(&local_60,"Making");
      local_a0 = pQVar4->stream;
      *(int *)(local_a0 + 0x28) = *(int *)(local_a0 + 0x28) + 1;
      ::operator<<((Stream *)local_50,(QWindow *)&local_a0);
      QDebug::operator<<((QDebug *)local_50,"top level window");
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug((QDebug *)&local_a0);
      QDebug::~QDebug(&local_60);
    }
LAB_0030128c:
    QWindow::setTransientParent(pQVar3);
  }
  else {
    if (((uint)windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      this_00 = QWidget::window(parentWithWindow);
      QWidget::windowHandle(this_00);
      lcWidgetWindow();
      if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0
         ) {
        local_80 = 2;
        local_7c = 0;
        uStack_74 = 0;
        local_6c = 0;
        local_68 = lcWidgetWindow::category.name;
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<(&local_60,"Setting");
        local_58 = pQVar4->stream;
        *(int *)(local_58 + 0x28) = *(int *)(local_58 + 0x28) + 1;
        ::operator<<((Stream *)local_50,(QWindow *)&local_58);
        pQVar4 = QDebug::operator<<((QDebug *)local_50,"transient parent to");
        local_48 = pQVar4->stream;
        *(int *)(local_48 + 0x28) = *(int *)(local_48 + 0x28) + 1;
        ::operator<<((Stream *)local_40,(QWindow *)&local_48);
        QDebug::~QDebug((QDebug *)local_40);
        QDebug::~QDebug((QDebug *)&local_48);
        QDebug::~QDebug((QDebug *)local_50);
        QDebug::~QDebug((QDebug *)&local_58);
        QDebug::~QDebug(&local_60);
      }
      goto LAB_0030128c;
    }
    QWidget::windowHandle(parentWithWindow);
    lcWidgetWindow();
    if (((byte)lcWidgetWindow::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0)
    {
      local_80 = 2;
      local_7c = 0;
      uStack_74 = 0;
      local_6c = 0;
      local_68 = lcWidgetWindow::category.name;
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(&local_60,"Reparenting");
      local_98 = pQVar4->stream;
      *(int *)(local_98 + 0x28) = *(int *)(local_98 + 0x28) + 1;
      ::operator<<((Stream *)local_50,(QWindow *)&local_98);
      pQVar4 = QDebug::operator<<((QDebug *)local_50,"into");
      local_90 = pQVar4->stream;
      *(int *)(local_90 + 0x28) = *(int *)(local_90 + 0x28) + 1;
      ::operator<<((Stream *)local_88,(QWindow *)&local_90);
      QDebug::~QDebug((QDebug *)local_88);
      QDebug::~QDebug((QDebug *)&local_90);
      QDebug::~QDebug((QDebug *)local_50);
      QDebug::~QDebug((QDebug *)&local_98);
      QDebug::~QDebug(&local_60);
    }
    QWindow::setTransientParent(pQVar3);
  }
  QWindow::setParent(pQVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003012ba:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::reparentWidgetWindows(QWidget *parentWithWindow, Qt::WindowFlags windowFlags)
{
    if (QWindow *window = windowHandle()) {
        // Reparent this QWindow, and all QWindow children will follow
        if (parentWithWindow) {
            if (windowFlags & Qt::Window) {
                // Top level windows can only have transient parents,
                // and the transient parent must be another top level.
                QWidget *topLevel = parentWithWindow->window();
                auto *transientParent = topLevel->windowHandle();
                Q_ASSERT(transientParent);
                qCDebug(lcWidgetWindow) << "Setting" << window << "transient parent to" << transientParent;
                window->setTransientParent(transientParent);
                window->setParent(nullptr);
            } else {
                auto *parentWindow = parentWithWindow->windowHandle();
                qCDebug(lcWidgetWindow) << "Reparenting" << window << "into" << parentWindow;
                window->setTransientParent(nullptr);
                window->setParent(parentWindow);
            }
        } else {
            qCDebug(lcWidgetWindow) << "Making" << window << "top level window";
            window->setTransientParent(nullptr);
            window->setParent(nullptr);
        }
    } else {
        reparentWidgetWindowChildren(parentWithWindow);
    }
}